

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O0

void lua_xmove(lua_State *from,lua_State *to,int n)

{
  undefined8 *puVar1;
  uint in_EDX;
  long in_RSI;
  long in_RDI;
  TValue *t;
  TValue *f;
  MSize in_stack_ffffffffffffffac;
  lua_State *in_stack_ffffffffffffffb0;
  undefined8 *local_48;
  uint local_3c;
  
  if (in_RDI != in_RSI) {
    if ((long)((ulong)*(uint *)(in_RSI + 0x20) - *(long *)(in_RSI + 0x18)) <=
        (long)((ulong)in_EDX * 8)) {
      lj_state_growstack(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
    }
    local_48 = *(undefined8 **)(in_RDI + 0x18);
    puVar1 = (undefined8 *)(*(long *)(in_RSI + 0x18) + (long)(int)in_EDX * 8);
    *(undefined8 **)(in_RSI + 0x18) = puVar1;
    local_3c = in_EDX;
    while (local_3c = local_3c - 1, -1 < (int)local_3c) {
      puVar1 = puVar1 + -1;
      local_48 = local_48 + -1;
      *puVar1 = *local_48;
    }
    *(undefined8 **)(in_RDI + 0x18) = local_48;
  }
  return;
}

Assistant:

LUA_API void lua_xmove(lua_State *from, lua_State *to, int n)
{
  TValue *f, *t;
  if (from == to) return;
  api_checknelems(from, n);
  api_check(from, G(from) == G(to));
  lj_state_checkstack(to, (MSize)n);
  f = from->top;
  t = to->top = to->top + n;
  while (--n >= 0) copyTV(to, --t, --f);
  from->top = f;
}